

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareOutputTexture(SmokeTest *this,size_t format_idx)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  long lVar5;
  _texture_format *format;
  Functions *gl;
  size_t format_idx_local;
  SmokeTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  lVar5 = format_idx * 0x78;
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_out_tex_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd53);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_out_tex_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd56);
  (**(code **)(lVar4 + 0x1310))
            (0xde1,0,*(undefined4 *)(texture_formats + lVar5 + 4),8,8,0,
             *(undefined4 *)(texture_formats + lVar5 + 8),
             *(undefined4 *)(texture_formats + lVar5 + 0xc),0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"TexImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd5a);
  (**(code **)(lVar4 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd5d);
  return;
}

Assistant:

void SmokeTest::prepareOutputTexture(size_t format_idx)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const _texture_format& format = texture_formats[format_idx];

	gl.genTextures(1, &m_out_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(GL_TEXTURE_2D, m_out_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, format.m_internal_format, m_output_width, m_output_height,
				  0 /* border */, format.m_format, format.m_type, 0 /* pixels */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}